

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_cmp_iso9660_identifier(isoent *p1,isoent *p2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  long lVar6;
  int local_38;
  int local_34;
  int l;
  int cmp;
  char *s2;
  char *s1;
  isoent *p2_local;
  isoent *p1_local;
  
  pcVar3 = p1->identifier;
  pcVar4 = p2->identifier;
  local_38 = p1->ext_off;
  if (p2->ext_off < local_38) {
    local_38 = p2->ext_off;
  }
  local_34 = memcmp(pcVar3,pcVar4,(long)local_38);
  p1_local._4_4_ = local_34;
  if (local_34 == 0) {
    if (p1->ext_off < p2->ext_off) {
      lVar6 = (long)local_38;
      local_38 = p2->ext_off - p1->ext_off;
      pbVar5 = (byte *)(pcVar4 + lVar6);
      do {
        _l = pbVar5;
        if (local_38 == 0) goto LAB_001b25c5;
        local_38 = local_38 + -1;
        pbVar5 = _l + 1;
      } while (*_l == 0x20);
      p1_local._4_4_ = 0x20 - (uint)*_l;
    }
    else if (p2->ext_off < p1->ext_off) {
      lVar6 = (long)local_38;
      local_38 = p1->ext_off - p2->ext_off;
      pcVar3 = pcVar3 + lVar6;
      do {
        s2 = pcVar3;
        if (local_38 == 0) goto LAB_001b25c5;
        local_38 = local_38 + -1;
        pcVar3 = s2 + 1;
      } while (*s2 == ' ');
      p1_local._4_4_ = (byte)*s2 - 0x20;
    }
    else {
LAB_001b25c5:
      if ((p1->ext_len == 0) && (p2->ext_len == 0)) {
        p1_local._4_4_ = 0;
      }
      else if ((p1->ext_len == 1) && (p2->ext_len == 1)) {
        p1_local._4_4_ = 0;
      }
      else if (p1->ext_len < 2) {
        p1_local._4_4_ = -1;
      }
      else if (p2->ext_len < 2) {
        p1_local._4_4_ = 1;
      }
      else {
        local_38 = p1->ext_len;
        if (p2->ext_len < local_38) {
          local_38 = p2->ext_len;
        }
        pcVar3 = p1->identifier;
        iVar1 = p1->ext_off;
        pcVar4 = p2->identifier;
        iVar2 = p2->ext_off;
        if ((local_38 < 2) ||
           (local_34 = memcmp(pcVar3 + iVar1,pcVar4 + iVar2,(long)local_38),
           p1_local._4_4_ = local_34, local_34 == 0)) {
          if (p1->ext_len < p2->ext_len) {
            lVar6 = (long)local_38;
            local_38 = p2->ext_len - p1->ext_len;
            pbVar5 = (byte *)(pcVar4 + iVar2 + lVar6);
            do {
              _l = pbVar5;
              if (local_38 == 0) goto LAB_001b27d6;
              local_38 = local_38 + -1;
              pbVar5 = _l + 1;
            } while (*_l == 0x20);
            p1_local._4_4_ = 0x20 - (uint)*_l;
          }
          else if (p2->ext_len < p1->ext_len) {
            lVar6 = (long)local_38;
            local_38 = p1->ext_len - p2->ext_len;
            pcVar3 = pcVar3 + iVar1 + lVar6;
            do {
              s2 = pcVar3;
              if (local_38 == 0) goto LAB_001b27d6;
              local_38 = local_38 + -1;
              pcVar3 = s2 + 1;
            } while (*s2 == ' ');
            p1_local._4_4_ = (byte)*s2 - 0x20;
          }
          else {
LAB_001b27d6:
            p1_local._4_4_ = local_34;
          }
        }
      }
    }
  }
  return p1_local._4_4_;
}

Assistant:

static int
isoent_cmp_iso9660_identifier(const struct isoent *p1, const struct isoent *p2)
{
	const char *s1, *s2;
	int cmp;
	int l;

	s1 = p1->identifier;
	s2 = p2->identifier;

	/* Compare File Name */
	l = p1->ext_off;
	if (l > p2->ext_off)
		l = p2->ext_off;
	cmp = memcmp(s1, s2, l);
	if (cmp != 0)
		return (cmp);
	if (p1->ext_off < p2->ext_off) {
		s2 += l;
		l = p2->ext_off - p1->ext_off;
		while (l--)
			if (0x20 != *s2++)
				return (0x20
				    - *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_off > p2->ext_off) {
		s1 += l;
		l = p1->ext_off - p2->ext_off;
		while (l--)
			if (0x20 != *s1++)
				return (*(const unsigned char *)(s1 - 1)
				    - 0x20);
	}
	/* Compare File Name Extension */
	if (p1->ext_len == 0 && p2->ext_len == 0)
		return (0);
	if (p1->ext_len == 1 && p2->ext_len == 1)
		return (0);
	if (p1->ext_len <= 1)
		return (-1);
	if (p2->ext_len <= 1)
		return (1);
	l = p1->ext_len;
	if (l > p2->ext_len)
		l = p2->ext_len;
	s1 = p1->identifier + p1->ext_off;
	s2 = p2->identifier + p2->ext_off;
	if (l > 1) {
		cmp = memcmp(s1, s2, l);
		if (cmp != 0)
			return (cmp);
	}
	if (p1->ext_len < p2->ext_len) {
		s2 += l;
		l = p2->ext_len - p1->ext_len;
		while (l--)
			if (0x20 != *s2++)
				return (0x20
				    - *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_len > p2->ext_len) {
		s1 += l;
		l = p1->ext_len - p2->ext_len;
		while (l--)
			if (0x20 != *s1++)
				return (*(const unsigned char *)(s1 - 1)
				    - 0x20);
	}
	/* Compare File Version Number */
	/* No operation. The File Version Number is always one. */

	return (cmp);
}